

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O2

void __thiscall
Vgm_Emu_Impl::update_fm_rates(Vgm_Emu_Impl *this,long *ym2413_rate,long *ym2612_rate)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  byte *pbVar4;
  
  for (pbVar4 = this->data + 0x40; pbVar4 < this->data_end; pbVar4 = pbVar4 + uVar3) {
    bVar1 = *pbVar4;
    uVar3 = 2;
    switch(bVar1) {
    case 0x61:
      uVar3 = 3;
      break;
    case 0x62:
    case 99:
    case 0x65:
switchD_0055a0e3_caseD_62:
      iVar2 = command_len((uint)bVar1);
      uVar3 = (long)iVar2;
      break;
    case 100:
      break;
    case 0x66:
      goto switchD_0055a0e3_caseD_66;
    case 0x67:
      uVar3 = (ulong)(*(int *)(pbVar4 + 3) + 7);
      break;
    default:
      switch(bVar1) {
      case 0x50:
        goto switchD_0055a0e3_caseD_64;
      case 0x52:
      case 0x53:
        *ym2612_rate = *ym2413_rate;
        ym2612_rate = ym2413_rate;
        break;
      case 0x54:
        *ym2413_rate = 0;
      case 0x51:
        break;
      default:
        goto switchD_0055a0e3_caseD_62;
      }
      *ym2612_rate = 0;
      goto switchD_0055a0e3_caseD_66;
    }
switchD_0055a0e3_caseD_64:
  }
switchD_0055a0e3_caseD_66:
  return;
}

Assistant:

void Vgm_Emu_Impl::update_fm_rates( long* ym2413_rate, long* ym2612_rate ) const
{
	byte const* p = data + 0x40;
	while ( p < data_end )
	{
		switch ( *p )
		{
		case cmd_end:
			return;
		
		case cmd_psg:
		case cmd_byte_delay:
			p += 2;
			break;
		
		case cmd_delay:
			p += 3;
			break;
		
		case cmd_data_block:
			p += 7 + get_le32( p + 3 );
			break;
		
		case cmd_ym2413:
			*ym2612_rate = 0;
			return;
		
		case cmd_ym2612_port0:
		case cmd_ym2612_port1:
			*ym2612_rate = *ym2413_rate;
			*ym2413_rate = 0;
			return;
		
		case cmd_ym2151:
			*ym2413_rate = 0;
			*ym2612_rate = 0;
			return;
		
		default:
			p += command_len( *p );
		}
	}
}